

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

string * __thiscall
wabt::(anonymous_namespace)::MakeDollarName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view name)

{
  undefined1 local_70 [8];
  string_view name_local;
  string local_40;
  allocator local_19;
  
  name_local.data_ = name.data_;
  local_70 = (undefined1  [8])this;
  std::__cxx11::string::string((string *)&name_local.size_,"$",&local_19);
  string_view::to_string_abi_cxx11_(&local_40,(string_view *)local_70);
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &name_local.size_,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&name_local.size_);
  return __return_storage_ptr__;
}

Assistant:

static std::string MakeDollarName(string_view name) {
  return std::string("$") + name.to_string();
}